

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<double,_4,_2>::Matrix(Matrix<double,_4,_2> *this,double *src)

{
  long lVar1;
  
  Vector<tcu::Vector<double,_4>,_2>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)(this->m_data).m_data[0].m_data + lVar1) =
         *(undefined8 *)((long)src + lVar1 * 2);
    *(undefined8 *)((long)(this->m_data).m_data[1].m_data + lVar1) =
         *(undefined8 *)((long)src + lVar1 * 2 + 8);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}